

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

void newenv(void)

{
  Env *this;
  
  this = (Env *)operator_new(0x68);
  Env::Env(this,current);
  current = this;
  return;
}

Assistant:

void newenv() {
    current = new Env(current);
}